

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSequenceRepeatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  Result *_result;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (this->ndArrayInterpretation == true) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SequenceRepeat","")
            ;
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SequenceRepeat","")
            ;
            validateRankCount(__return_storage_ptr__,layer,&local_70,5,-1,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSequenceRepeatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SequenceRepeat", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SequenceRepeat", 5, -1, blobNameToRank));
    }

    return Result();
}